

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O2

void __thiscall xLearn::Model::SerializeToTXT(Model *this,string *filename)

{
  int iVar1;
  ostream *poVar2;
  index_t i;
  index_t d;
  uint uVar3;
  ulong uVar4;
  index_t j;
  float *pfVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  allocator local_26a;
  allocator local_269;
  Logger local_268;
  uint local_264;
  ulong local_260;
  ulong local_258;
  string local_250;
  ofstream o_file;
  undefined1 auVar8 [16];
  
  if (filename->_M_string_length != 0) {
    std::ofstream::ofstream((ostream *)&o_file,(string *)filename,_S_out);
    poVar2 = std::operator<<((ostream *)&o_file,"bias: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*this->param_b_);
    std::operator<<(poVar2,"\n");
    for (uVar6 = 0; (uint)uVar6 < this->param_num_w_; uVar6 = (ulong)((uint)uVar6 + this->aux_size_)
        ) {
      poVar2 = std::operator<<((ostream *)&o_file,"i_");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->param_w_[uVar6]);
      std::operator<<(poVar2,"\n");
    }
    iVar1 = std::__cxx11::string::compare((char *)this);
    auVar7._8_8_ = extraout_XMM1_Qb;
    auVar7._0_8_ = extraout_XMM1_Qa;
    if (iVar1 == 0) {
      auVar7 = vcvtusi2ss_avx512f(auVar7,this->num_K_);
      pfVar5 = this->param_v_;
      uVar6 = 0;
      auVar7 = ZEXT416((uint)(auVar7._0_4_ * 0.25));
      auVar7 = vroundss_avx(auVar7,auVar7,10);
      iVar1 = vcvttss2usi_avx512f(auVar7);
      for (; uVar6 < this->num_feat_; uVar6 = uVar6 + 1) {
        poVar2 = std::operator<<((ostream *)&o_file,"v_");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2,": ");
        for (uVar3 = 0; uVar3 < this->num_K_; uVar3 = uVar3 + 1) {
          std::ostream::operator<<((ostream *)&o_file,*pfVar5);
          if (uVar3 != this->num_K_ - 1) {
            std::operator<<((ostream *)&o_file," ");
          }
          pfVar5 = pfVar5 + 1;
        }
        std::operator<<((ostream *)&o_file,"\n");
        pfVar5 = pfVar5 + (this->aux_size_ * iVar1 * 4 - this->num_K_);
      }
    }
    iVar1 = std::__cxx11::string::compare((char *)this);
    auVar8._8_8_ = extraout_XMM1_Qb_00;
    auVar8._0_8_ = extraout_XMM1_Qa_00;
    if (iVar1 == 0) {
      auVar7 = vcvtusi2ss_avx512f(auVar8,this->num_K_);
      pfVar5 = this->param_v_;
      uVar6 = 0;
      auVar7 = ZEXT416((uint)(auVar7._0_4_ * 0.25));
      auVar7 = vroundss_avx(auVar7,auVar7,10);
      iVar1 = vcvttss2usi_avx512f(auVar7);
      local_264 = iVar1 << 2;
      while (uVar6 < this->num_feat_) {
        uVar4 = 0;
        local_260 = uVar6;
        while (uVar4 < this->num_field_) {
          poVar2 = std::operator<<((ostream *)&o_file,"v_");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          poVar2 = std::operator<<(poVar2,"_");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::operator<<(poVar2,": ");
          local_258 = uVar4;
          uVar3 = 0;
          while (uVar3 < local_264) {
            for (iVar1 = 0; iVar1 != 4; iVar1 = iVar1 + 1) {
              if (uVar3 + iVar1 < this->num_K_) {
                std::ostream::operator<<((ostream *)&o_file,*pfVar5);
                if (uVar3 + iVar1 != this->num_K_ - 1) {
                  std::operator<<((ostream *)&o_file," ");
                }
              }
              pfVar5 = pfVar5 + 1;
            }
            pfVar5 = pfVar5 + (this->aux_size_ * 4 - 4);
            uVar3 = uVar3 + 4;
          }
          std::operator<<((ostream *)&o_file,"\n");
          uVar4 = local_258 + 1;
        }
        uVar6 = local_260 + 1;
      }
    }
    std::ofstream::~ofstream(&o_file);
    return;
  }
  local_268.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&o_file,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
             ,&local_269);
  std::__cxx11::string::string((string *)&local_250,"SerializeToTXT",&local_26a);
  poVar2 = Logger::Start(ERR,(string *)&o_file,0xef,&local_250);
  poVar2 = std::operator<<(poVar2,"CHECK_NE failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xef);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"filename.empty()");
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"true");
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&o_file);
  Logger::~Logger(&local_268);
  abort();
}

Assistant:

void Model::SerializeToTXT(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
  std::ofstream o_file(filename);
  /*********************************************************
   *  Write linear and bias term                      *
   *********************************************************/
  // bias term
  o_file << "bias: " << param_b_[0] << "\n";
  // linear term
  index_t idx = 0;
  for (index_t i = 0; i < param_num_w_; i += aux_size_) {
    o_file << "i_" << idx << ": " << param_w_[i] << "\n";
    idx++;
  }
  /*********************************************************
   *  Write latent factor for fm                      *
   *********************************************************/
  if (score_func_.compare("fm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t* w = param_v_;
    for (index_t j = 0; j < num_feat_; ++j) {
      o_file << "v_" << j << ": ";
      for(index_t d = 0; d < num_K_; d++, w++) {
        o_file << *w;
        if (d != num_K_-1) {
          o_file << " ";
        }
      }
      o_file << "\n";
      // skip the rest parameters
      index_t skip = aux_size_*k_aligned-num_K_;
      w += skip;
    }
  }
  /*********************************************************
   *  Write latent factor for ffm                     *
   *********************************************************/
  if (score_func_.compare("ffm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t* w = param_v_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for (index_t f = 0; f < num_field_; ++f) {
        o_file << "v_" << j << "_" << f << ": ";
        for (index_t d = 0; d < k_aligned; ) {
          for (index_t s = 0; s < kAlign; s++, w++, d++) {
            if (d < num_K_) {
              o_file << w[0];
              if (d != num_K_-1) {
                o_file << " ";
              }
            }
          }
          w += (aux_size_-1) * kAlign;
        }
        o_file << "\n";
      }
    }
  }
}